

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O1

void Resmpl_ChooseResampler(RESMPL_STATE *CAA)

{
  UINT8 UVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  
  UVar1 = CAA->resampleMode;
  if (UVar1 == '\x02') {
    uVar2 = CAA->smpRateSrc;
    uVar3 = CAA->smpRateDst;
    if (uVar2 < uVar3) {
LAB_00122ddc:
      pcVar4 = Resmpl_Exec_LinearUp;
      goto LAB_00122df2;
    }
    if (uVar2 != uVar3) {
      if (uVar2 <= uVar3) {
        return;
      }
      pcVar4 = Resmpl_Exec_Old;
      goto LAB_00122df2;
    }
  }
  else if (UVar1 == '\x01') {
    uVar2 = CAA->smpRateSrc;
    uVar3 = CAA->smpRateDst;
    pcVar4 = Resmpl_Exec_Old;
    if (uVar2 < uVar3) goto LAB_00122df2;
    if (uVar2 != uVar3) {
      if (uVar2 < uVar3 || uVar2 == uVar3) {
        return;
      }
      goto LAB_00122df2;
    }
  }
  else {
    if (UVar1 != '\0') {
      pcVar4 = (RESAMPLER_FUNC)0x0;
      goto LAB_00122df2;
    }
    uVar2 = CAA->smpRateSrc;
    uVar3 = CAA->smpRateDst;
    if (uVar2 < uVar3) goto LAB_00122ddc;
    if (uVar2 != uVar3) {
      if (uVar2 <= uVar3) {
        return;
      }
      pcVar4 = Resmpl_Exec_LinearDown;
      goto LAB_00122df2;
    }
  }
  pcVar4 = Resmpl_Exec_Copy;
LAB_00122df2:
  CAA->resampler = pcVar4;
  return;
}

Assistant:

static void Resmpl_ChooseResampler(RESMPL_STATE* CAA)
{
	switch(CAA->resampleMode)
	{
	case RSMODE_LINEAR:	// linear interpolation (good quality)
		if (CAA->smpRateSrc < CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_LinearUp;
		else if (CAA->smpRateSrc == CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Copy;
		else if (CAA->smpRateSrc > CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_LinearDown;
		break;
	case RSMODE_NEAREST:	// nearest-neighbour (low quality)
		if (CAA->smpRateSrc < CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Old;
		else if (CAA->smpRateSrc == CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Copy;
		else if (CAA->smpRateSrc > CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Old;
		break;
	case RSMODE_LUP_NDWN:	// nearest-neighbour downsampling, interpolation upsampling
		if (CAA->smpRateSrc < CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_LinearUp;
		else if (CAA->smpRateSrc == CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Copy;
		else if (CAA->smpRateSrc > CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Old;
		break;
	default:
#ifdef _DEBUG
		printf("Invalid resampler mode 0x%02X used!\n", CAA->resampleMode);
#endif
		CAA->resampler = NULL;
		break;
	}
}